

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

void __thiscall
CVmObjVector::insert_elements_undo(CVmObjVector *this,vm_obj_id_t self,int ins_idx,int add_cnt)

{
  size_t idx;
  ushort uVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  vm_val_t ele;
  vm_val_t local_40;
  
  uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
  uVar4 = (ulong)uVar1;
  lVar6 = (long)add_cnt;
  set_element_count_undo(this,self,uVar4 + lVar6);
  if (ins_idx < (int)(uint)uVar1) {
    lVar3 = uVar4 * 5 + -1;
    uVar5 = uVar4;
    do {
      pcVar2 = (this->super_CVmObjCollection).super_CVmObject.ext_;
      local_40.typ = (vm_datatype_t)pcVar2[lVar3];
      vmb_get_dh_val(pcVar2 + lVar3,&local_40);
      idx = uVar5 + lVar6 + -1;
      if ((long)idx < (long)uVar4) {
        set_element_undo(this,self,idx,&local_40);
      }
      else {
        vmb_put_dh((this->super_CVmObjCollection).super_CVmObject.ext_ + lVar3 + lVar6 * 5,&local_40
                  );
      }
      uVar5 = uVar5 - 1;
      lVar3 = lVar3 + -5;
    } while ((long)ins_idx < (long)uVar5);
  }
  return;
}

Assistant:

void CVmObjVector::insert_elements_undo(VMG_ vm_obj_id_t self,
                                        int ins_idx, int add_cnt)
{
    /* note the new and old sizes */
    int old_cnt = get_element_count();
    int new_cnt = old_cnt + add_cnt;

    /* create the new elements */
    set_element_count_undo(vmg_ self, new_cnt);

    /* 
     *   Move the existing elements to their new slots.  Start with the
     *   starting index, and move it to its new position, since the starting
     *   index is the first element that needs to be moved.  Note that we
     *   start at the top and work down, to avoid overwriting any overlapping
     *   part of the new position block and the old position block.
     *   
     *   If we're inserting after the last element, there's no moving that
     *   needs to be done.  
     */
    if (ins_idx < old_cnt)
    {
        for (int idx = old_cnt - 1 ; idx >= ins_idx ; --idx)
        {
            /* get the value at this slot */
            vm_val_t ele;
            get_element(idx, &ele);

            /* calculate the new slot */
            int new_idx = idx + add_cnt;

            /* 
             *   if the new index is within the old size range, keep undo for
             *   the change; otherwise, no undo is necessary, since when we
             *   undo we'll be completely dropping this new slot 
             */
            if (new_idx < old_cnt)
                set_element_undo(vmg_ self, new_idx, &ele);
            else
                set_element(new_idx, &ele);
        }
    }
}